

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SRGBTestCase::logColor
          (SRGBTestCase *this,string *colorLogMessage,int colorIdx,Vec4 *color)

{
  ostringstream *this_00;
  TestLog *pTVar1;
  ostream *poVar2;
  ostringstream message;
  long *local_340;
  long local_338;
  long local_330 [2];
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  pTVar1 = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream(local_320);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_320,(colorLogMessage->_M_dataplus)._M_p,
                      colorLogMessage->_M_string_length);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,colorIdx);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," = (",4);
  poVar2 = std::ostream::_M_insert<double>((double)color->m_data[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)color->m_data[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)color->m_data[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)color->m_data[3]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  this_00 = (ostringstream *)(local_1a8 + 8);
  local_1a8._0_8_ = pTVar1;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,(char *)local_340,local_338)
  ;
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if (local_340 != local_330) {
    operator_delete(local_340,local_330[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_130);
  std::__cxx11::ostringstream::~ostringstream(local_320);
  std::ios_base::~ios_base(local_2b0);
  return;
}

Assistant:

void SRGBTestCase::logColor (const std::string& colorLogMessage, int colorIdx, tcu::Vec4 color) const
{
	tcu::TestLog&			log		= m_context.getTestContext().getLog();
	std::ostringstream		message;

	message << colorLogMessage << colorIdx << " = (" << color.x() << ", " << color.y() << ", " << color.z() << ", " << color.w() << ")";
	log << tcu::TestLog::Message << message.str() << tcu::TestLog::EndMessage;
}